

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildInstrToBlockMapping(IRContext *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  undefined8 *puVar4;
  pointer puVar5;
  undefined8 *puVar6;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->instr_to_block_)._M_h);
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  for (puVar5 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    _Var3.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar5->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    puVar4 = *(undefined8 **)
              ((long)_Var3.
                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                     .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0);
    for (puVar6 = *(undefined8 **)
                   ((long)_Var3.
                          super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                          .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                   0x98); puVar6 != puVar4; puVar6 = puVar6 + 1) {
      local_50._8_8_ = *puVar6;
      local_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h:705:27)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h:705:27)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      BasicBlock::ForEachInst
                ((BasicBlock *)local_50._8_8_,
                 (function<void_(spvtools::opt::Instruction_*)> *)&local_50,false);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisInstrToBlockMapping
  ;
  return;
}

Assistant:

void BuildInstrToBlockMapping() {
    instr_to_block_.clear();
    for (auto& fn : *module_) {
      for (auto& block : fn) {
        block.ForEachInst([this, &block](Instruction* inst) {
          instr_to_block_[inst] = &block;
        });
      }
    }
    valid_analyses_ = valid_analyses_ | kAnalysisInstrToBlockMapping;
  }